

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitSIMDBinary
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  bool bVar1;
  Expression *pEVar2;
  Binary *local_30;
  Binary *curr;
  uint32_t code_local;
  Expression **out_local;
  WasmBinaryBuilder *this_local;
  
  switch(code) {
  case 0xe:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SwizzleVecI8x16;
    break;
  default:
    return false;
  case 0x23:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqVecI8x16;
    break;
  case 0x24:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeVecI8x16;
    break;
  case 0x25:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtSVecI8x16;
    break;
  case 0x26:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtUVecI8x16;
    break;
  case 0x27:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtSVecI8x16;
    break;
  case 0x28:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtUVecI8x16;
    break;
  case 0x29:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeSVecI8x16;
    break;
  case 0x2a:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeUVecI8x16;
    break;
  case 0x2b:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeSVecI8x16;
    break;
  case 0x2c:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeUVecI8x16;
    break;
  case 0x2d:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqVecI16x8;
    break;
  case 0x2e:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeVecI16x8;
    break;
  case 0x2f:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtSVecI16x8;
    break;
  case 0x30:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtUVecI16x8;
    break;
  case 0x31:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtSVecI16x8;
    break;
  case 0x32:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtUVecI16x8;
    break;
  case 0x33:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeSVecI16x8;
    break;
  case 0x34:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeUVecI16x8;
    break;
  case 0x35:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeSVecI16x8;
    break;
  case 0x36:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeUVecI16x8;
    break;
  case 0x37:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqVecI32x4;
    break;
  case 0x38:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeVecI32x4;
    break;
  case 0x39:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtSVecI32x4;
    break;
  case 0x3a:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtUVecI32x4;
    break;
  case 0x3b:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtSVecI32x4;
    break;
  case 0x3c:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtUVecI32x4;
    break;
  case 0x3d:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeSVecI32x4;
    break;
  case 0x3e:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeUVecI32x4;
    break;
  case 0x3f:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeSVecI32x4;
    break;
  case 0x40:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeUVecI32x4;
    break;
  case 0x41:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqVecF32x4;
    break;
  case 0x42:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeVecF32x4;
    break;
  case 0x43:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtVecF32x4;
    break;
  case 0x44:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtVecF32x4;
    break;
  case 0x45:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeVecF32x4;
    break;
  case 0x46:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeVecF32x4;
    break;
  case 0x47:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqVecF64x2;
    break;
  case 0x48:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeVecF64x2;
    break;
  case 0x49:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtVecF64x2;
    break;
  case 0x4a:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtVecF64x2;
    break;
  case 0x4b:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeVecF64x2;
    break;
  case 0x4c:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeVecF64x2;
    break;
  case 0x4e:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AndVec128;
    break;
  case 0x4f:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AndNotVec128;
    break;
  case 0x50:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = OrVec128;
    break;
  case 0x51:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = XorVec128;
    break;
  case 0x65:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NarrowSVecI16x8ToVecI8x16;
    break;
  case 0x66:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NarrowUVecI16x8ToVecI8x16;
    break;
  case 0x6e:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddVecI8x16;
    break;
  case 0x6f:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddSatSVecI8x16;
    break;
  case 0x70:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddSatUVecI8x16;
    break;
  case 0x71:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubVecI8x16;
    break;
  case 0x72:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubSatSVecI8x16;
    break;
  case 0x73:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubSatUVecI8x16;
    break;
  case 0x76:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinSVecI8x16;
    break;
  case 0x77:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinUVecI8x16;
    break;
  case 0x78:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxSVecI8x16;
    break;
  case 0x79:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxUVecI8x16;
    break;
  case 0x7b:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AvgrUVecI8x16;
    break;
  case 0x82:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = Q15MulrSatSVecI16x8;
    break;
  case 0x85:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NarrowSVecI32x4ToVecI16x8;
    break;
  case 0x86:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NarrowUVecI32x4ToVecI16x8;
    break;
  case 0x8e:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddVecI16x8;
    break;
  case 0x8f:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddSatSVecI16x8;
    break;
  case 0x90:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddSatUVecI16x8;
    break;
  case 0x91:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubVecI16x8;
    break;
  case 0x92:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubSatSVecI16x8;
    break;
  case 0x93:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubSatUVecI16x8;
    break;
  case 0x95:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulVecI16x8;
    break;
  case 0x96:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinSVecI16x8;
    break;
  case 0x97:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinUVecI16x8;
    break;
  case 0x98:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxSVecI16x8;
    break;
  case 0x99:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxUVecI16x8;
    break;
  case 0x9b:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AvgrUVecI16x8;
    break;
  case 0x9c:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulLowSVecI16x8;
    break;
  case 0x9d:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulHighSVecI16x8;
    break;
  case 0x9e:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulLowUVecI16x8;
    break;
  case 0x9f:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulHighUVecI16x8;
    break;
  case 0xae:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddVecI32x4;
    break;
  case 0xb1:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubVecI32x4;
    break;
  case 0xb5:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulVecI32x4;
    break;
  case 0xb6:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinSVecI32x4;
    break;
  case 0xb7:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinUVecI32x4;
    break;
  case 0xb8:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxSVecI32x4;
    break;
  case 0xb9:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxUVecI32x4;
    break;
  case 0xba:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DotSVecI16x8ToVecI32x4;
    break;
  case 0xbc:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulLowSVecI32x4;
    break;
  case 0xbd:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulHighSVecI32x4;
    break;
  case 0xbe:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulLowUVecI32x4;
    break;
  case 0xbf:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulHighUVecI32x4;
    break;
  case 0xce:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddVecI64x2;
    break;
  case 0xd1:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubVecI64x2;
    break;
  case 0xd5:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulVecI64x2;
    break;
  case 0xd6:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = EqVecI64x2;
    break;
  case 0xd7:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = NeVecI64x2;
    break;
  case 0xd8:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LtSVecI64x2;
    break;
  case 0xd9:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GtSVecI64x2;
    break;
  case 0xda:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = LeSVecI64x2;
    break;
  case 0xdb:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = GeSVecI64x2;
    break;
  case 0xdc:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulLowSVecI64x2;
    break;
  case 0xdd:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulHighSVecI64x2;
    break;
  case 0xde:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulLowUVecI64x2;
    break;
  case 0xdf:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = ExtMulHighUVecI64x2;
    break;
  case 0xe4:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddVecF32x4;
    break;
  case 0xe5:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubVecF32x4;
    break;
  case 0xe6:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulVecF32x4;
    break;
  case 0xe7:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivVecF32x4;
    break;
  case 0xe8:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinVecF32x4;
    break;
  case 0xe9:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxVecF32x4;
    break;
  case 0xea:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = PMinVecF32x4;
    break;
  case 0xeb:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = PMaxVecF32x4;
    break;
  case 0xf0:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = AddVecF64x2;
    break;
  case 0xf1:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = SubVecF64x2;
    break;
  case 0xf2:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MulVecF64x2;
    break;
  case 0xf3:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DivVecF64x2;
    break;
  case 0xf4:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MinVecF64x2;
    break;
  case 0xf5:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = MaxVecF64x2;
    break;
  case 0xf6:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = PMinVecF64x2;
    break;
  case 0xf7:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = PMaxVecF64x2;
    break;
  case 0x100:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RelaxedSwizzleVecI8x16;
    break;
  case 0x10d:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RelaxedMinVecF32x4;
    break;
  case 0x10e:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RelaxedMaxVecF32x4;
    break;
  case 0x10f:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RelaxedMinVecF64x2;
    break;
  case 0x110:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RelaxedMaxVecF64x2;
    break;
  case 0x111:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = RelaxedQ15MulrSVecI16x8;
    break;
  case 0x112:
    local_30 = MixedArena::alloc<wasm::Binary>(this->allocator);
    local_30->op = DotI8x16I7x16SToVecI16x8;
  }
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"zz node: Binary\n");
  }
  pEVar2 = popNonVoidExpression(this);
  local_30->right = pEVar2;
  pEVar2 = popNonVoidExpression(this);
  local_30->left = pEVar2;
  Binary::finalize(local_30);
  *out = (Expression *)local_30;
  return true;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitSIMDBinary(Expression*& out, uint32_t code) {
  Binary* curr;
  switch (code) {
    case BinaryConsts::I8x16Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI8x16;
      break;
    case BinaryConsts::I8x16Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI8x16;
      break;
    case BinaryConsts::I8x16LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI8x16;
      break;
    case BinaryConsts::I8x16LtU:
      curr = allocator.alloc<Binary>();
      curr->op = LtUVecI8x16;
      break;
    case BinaryConsts::I8x16GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI8x16;
      break;
    case BinaryConsts::I8x16GtU:
      curr = allocator.alloc<Binary>();
      curr->op = GtUVecI8x16;
      break;
    case BinaryConsts::I8x16LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI8x16;
      break;
    case BinaryConsts::I8x16LeU:
      curr = allocator.alloc<Binary>();
      curr->op = LeUVecI8x16;
      break;
    case BinaryConsts::I8x16GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI8x16;
      break;
    case BinaryConsts::I8x16GeU:
      curr = allocator.alloc<Binary>();
      curr->op = GeUVecI8x16;
      break;
    case BinaryConsts::I16x8Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI16x8;
      break;
    case BinaryConsts::I16x8Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI16x8;
      break;
    case BinaryConsts::I16x8LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI16x8;
      break;
    case BinaryConsts::I16x8LtU:
      curr = allocator.alloc<Binary>();
      curr->op = LtUVecI16x8;
      break;
    case BinaryConsts::I16x8GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI16x8;
      break;
    case BinaryConsts::I16x8GtU:
      curr = allocator.alloc<Binary>();
      curr->op = GtUVecI16x8;
      break;
    case BinaryConsts::I16x8LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI16x8;
      break;
    case BinaryConsts::I16x8LeU:
      curr = allocator.alloc<Binary>();
      curr->op = LeUVecI16x8;
      break;
    case BinaryConsts::I16x8GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI16x8;
      break;
    case BinaryConsts::I16x8GeU:
      curr = allocator.alloc<Binary>();
      curr->op = GeUVecI16x8;
      break;
    case BinaryConsts::I32x4Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI32x4;
      break;
    case BinaryConsts::I32x4Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI32x4;
      break;
    case BinaryConsts::I32x4LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI32x4;
      break;
    case BinaryConsts::I32x4LtU:
      curr = allocator.alloc<Binary>();
      curr->op = LtUVecI32x4;
      break;
    case BinaryConsts::I32x4GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI32x4;
      break;
    case BinaryConsts::I32x4GtU:
      curr = allocator.alloc<Binary>();
      curr->op = GtUVecI32x4;
      break;
    case BinaryConsts::I32x4LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI32x4;
      break;
    case BinaryConsts::I32x4LeU:
      curr = allocator.alloc<Binary>();
      curr->op = LeUVecI32x4;
      break;
    case BinaryConsts::I32x4GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI32x4;
      break;
    case BinaryConsts::I32x4GeU:
      curr = allocator.alloc<Binary>();
      curr->op = GeUVecI32x4;
      break;
    case BinaryConsts::I64x2Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI64x2;
      break;
    case BinaryConsts::I64x2Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI64x2;
      break;
    case BinaryConsts::I64x2LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI64x2;
      break;
    case BinaryConsts::I64x2GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI64x2;
      break;
    case BinaryConsts::I64x2LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI64x2;
      break;
    case BinaryConsts::I64x2GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI64x2;
      break;
    case BinaryConsts::F32x4Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecF32x4;
      break;
    case BinaryConsts::F32x4Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecF32x4;
      break;
    case BinaryConsts::F32x4Lt:
      curr = allocator.alloc<Binary>();
      curr->op = LtVecF32x4;
      break;
    case BinaryConsts::F32x4Gt:
      curr = allocator.alloc<Binary>();
      curr->op = GtVecF32x4;
      break;
    case BinaryConsts::F32x4Le:
      curr = allocator.alloc<Binary>();
      curr->op = LeVecF32x4;
      break;
    case BinaryConsts::F32x4Ge:
      curr = allocator.alloc<Binary>();
      curr->op = GeVecF32x4;
      break;
    case BinaryConsts::F64x2Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecF64x2;
      break;
    case BinaryConsts::F64x2Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecF64x2;
      break;
    case BinaryConsts::F64x2Lt:
      curr = allocator.alloc<Binary>();
      curr->op = LtVecF64x2;
      break;
    case BinaryConsts::F64x2Gt:
      curr = allocator.alloc<Binary>();
      curr->op = GtVecF64x2;
      break;
    case BinaryConsts::F64x2Le:
      curr = allocator.alloc<Binary>();
      curr->op = LeVecF64x2;
      break;
    case BinaryConsts::F64x2Ge:
      curr = allocator.alloc<Binary>();
      curr->op = GeVecF64x2;
      break;
    case BinaryConsts::V128And:
      curr = allocator.alloc<Binary>();
      curr->op = AndVec128;
      break;
    case BinaryConsts::V128Or:
      curr = allocator.alloc<Binary>();
      curr->op = OrVec128;
      break;
    case BinaryConsts::V128Xor:
      curr = allocator.alloc<Binary>();
      curr->op = XorVec128;
      break;
    case BinaryConsts::V128Andnot:
      curr = allocator.alloc<Binary>();
      curr->op = AndNotVec128;
      break;
    case BinaryConsts::I8x16Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI8x16;
      break;
    case BinaryConsts::I8x16AddSatS:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatSVecI8x16;
      break;
    case BinaryConsts::I8x16AddSatU:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatUVecI8x16;
      break;
    case BinaryConsts::I8x16Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI8x16;
      break;
    case BinaryConsts::I8x16SubSatS:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatSVecI8x16;
      break;
    case BinaryConsts::I8x16SubSatU:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatUVecI8x16;
      break;
    case BinaryConsts::I8x16MinS:
      curr = allocator.alloc<Binary>();
      curr->op = MinSVecI8x16;
      break;
    case BinaryConsts::I8x16MinU:
      curr = allocator.alloc<Binary>();
      curr->op = MinUVecI8x16;
      break;
    case BinaryConsts::I8x16MaxS:
      curr = allocator.alloc<Binary>();
      curr->op = MaxSVecI8x16;
      break;
    case BinaryConsts::I8x16MaxU:
      curr = allocator.alloc<Binary>();
      curr->op = MaxUVecI8x16;
      break;
    case BinaryConsts::I8x16AvgrU:
      curr = allocator.alloc<Binary>();
      curr->op = AvgrUVecI8x16;
      break;
    case BinaryConsts::I16x8Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI16x8;
      break;
    case BinaryConsts::I16x8AddSatS:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatSVecI16x8;
      break;
    case BinaryConsts::I16x8AddSatU:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatUVecI16x8;
      break;
    case BinaryConsts::I16x8Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI16x8;
      break;
    case BinaryConsts::I16x8SubSatS:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatSVecI16x8;
      break;
    case BinaryConsts::I16x8SubSatU:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatUVecI16x8;
      break;
    case BinaryConsts::I16x8Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecI16x8;
      break;
    case BinaryConsts::I16x8MinS:
      curr = allocator.alloc<Binary>();
      curr->op = MinSVecI16x8;
      break;
    case BinaryConsts::I16x8MinU:
      curr = allocator.alloc<Binary>();
      curr->op = MinUVecI16x8;
      break;
    case BinaryConsts::I16x8MaxS:
      curr = allocator.alloc<Binary>();
      curr->op = MaxSVecI16x8;
      break;
    case BinaryConsts::I16x8MaxU:
      curr = allocator.alloc<Binary>();
      curr->op = MaxUVecI16x8;
      break;
    case BinaryConsts::I16x8AvgrU:
      curr = allocator.alloc<Binary>();
      curr->op = AvgrUVecI16x8;
      break;
    case BinaryConsts::I16x8Q15MulrSatS:
      curr = allocator.alloc<Binary>();
      curr->op = Q15MulrSatSVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulLowI8x16S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowSVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulHighI8x16S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighSVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulLowI8x16U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowUVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulHighI8x16U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighUVecI16x8;
      break;
    case BinaryConsts::I32x4Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI32x4;
      break;
    case BinaryConsts::I32x4Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI32x4;
      break;
    case BinaryConsts::I32x4Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecI32x4;
      break;
    case BinaryConsts::I32x4MinS:
      curr = allocator.alloc<Binary>();
      curr->op = MinSVecI32x4;
      break;
    case BinaryConsts::I32x4MinU:
      curr = allocator.alloc<Binary>();
      curr->op = MinUVecI32x4;
      break;
    case BinaryConsts::I32x4MaxS:
      curr = allocator.alloc<Binary>();
      curr->op = MaxSVecI32x4;
      break;
    case BinaryConsts::I32x4MaxU:
      curr = allocator.alloc<Binary>();
      curr->op = MaxUVecI32x4;
      break;
    case BinaryConsts::I32x4DotI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = DotSVecI16x8ToVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulLowI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowSVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulHighI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighSVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulLowI16x8U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowUVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulHighI16x8U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighUVecI32x4;
      break;
    case BinaryConsts::I64x2Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI64x2;
      break;
    case BinaryConsts::I64x2Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI64x2;
      break;
    case BinaryConsts::I64x2Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulLowI32x4S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowSVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulHighI32x4S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighSVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulLowI32x4U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowUVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulHighI32x4U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighUVecI64x2;
      break;
    case BinaryConsts::F32x4Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecF32x4;
      break;
    case BinaryConsts::F32x4Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecF32x4;
      break;
    case BinaryConsts::F32x4Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecF32x4;
      break;
    case BinaryConsts::F32x4Div:
      curr = allocator.alloc<Binary>();
      curr->op = DivVecF32x4;
      break;
    case BinaryConsts::F32x4Min:
      curr = allocator.alloc<Binary>();
      curr->op = MinVecF32x4;
      break;
    case BinaryConsts::F32x4Max:
      curr = allocator.alloc<Binary>();
      curr->op = MaxVecF32x4;
      break;
    case BinaryConsts::F32x4Pmin:
      curr = allocator.alloc<Binary>();
      curr->op = PMinVecF32x4;
      break;
    case BinaryConsts::F32x4Pmax:
      curr = allocator.alloc<Binary>();
      curr->op = PMaxVecF32x4;
      break;
    case BinaryConsts::F64x2Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecF64x2;
      break;
    case BinaryConsts::F64x2Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecF64x2;
      break;
    case BinaryConsts::F64x2Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecF64x2;
      break;
    case BinaryConsts::F64x2Div:
      curr = allocator.alloc<Binary>();
      curr->op = DivVecF64x2;
      break;
    case BinaryConsts::F64x2Min:
      curr = allocator.alloc<Binary>();
      curr->op = MinVecF64x2;
      break;
    case BinaryConsts::F64x2Max:
      curr = allocator.alloc<Binary>();
      curr->op = MaxVecF64x2;
      break;
    case BinaryConsts::F64x2Pmin:
      curr = allocator.alloc<Binary>();
      curr->op = PMinVecF64x2;
      break;
    case BinaryConsts::F64x2Pmax:
      curr = allocator.alloc<Binary>();
      curr->op = PMaxVecF64x2;
      break;
    case BinaryConsts::I8x16NarrowI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowSVecI16x8ToVecI8x16;
      break;
    case BinaryConsts::I8x16NarrowI16x8U:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowUVecI16x8ToVecI8x16;
      break;
    case BinaryConsts::I16x8NarrowI32x4S:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowSVecI32x4ToVecI16x8;
      break;
    case BinaryConsts::I16x8NarrowI32x4U:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowUVecI32x4ToVecI16x8;
      break;
    case BinaryConsts::I8x16Swizzle:
      curr = allocator.alloc<Binary>();
      curr->op = SwizzleVecI8x16;
      break;
    case BinaryConsts::I8x16RelaxedSwizzle:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedSwizzleVecI8x16;
      break;
    case BinaryConsts::F32x4RelaxedMin:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMinVecF32x4;
      break;
    case BinaryConsts::F32x4RelaxedMax:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMaxVecF32x4;
      break;
    case BinaryConsts::F64x2RelaxedMin:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMinVecF64x2;
      break;
    case BinaryConsts::F64x2RelaxedMax:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMaxVecF64x2;
      break;
    case BinaryConsts::I16x8RelaxedQ15MulrS:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedQ15MulrSVecI16x8;
      break;
    case BinaryConsts::I16x8DotI8x16I7x16S:
      curr = allocator.alloc<Binary>();
      curr->op = DotI8x16I7x16SToVecI16x8;
      break;
    default:
      return false;
  }
  BYN_TRACE("zz node: Binary\n");
  curr->right = popNonVoidExpression();
  curr->left = popNonVoidExpression();
  curr->finalize();
  out = curr;
  return true;
}